

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O2

QDebug operator<<(QDebug d,QHostAddress *address)

{
  long lVar1;
  QHostAddressPrivate *pQVar2;
  long *plVar3;
  QDebug *pQVar4;
  QHostAddress *in_RDX;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)address);
  plVar3 = (long *)QDebug::resetFormat();
  *(undefined1 *)(*plVar3 + 0x30) = 0;
  if (((in_RDX->d).d.ptr)->protocol == '\x02') {
    QDebug::operator<<((QDebug *)address,"QHostAddress(QHostAddress::Any)");
  }
  else {
    pQVar4 = QDebug::operator<<((QDebug *)address,"QHostAddress(");
    QHostAddress::toString((QString *)&local_50,in_RDX);
    pQVar4 = QDebug::operator<<(pQVar4,(QString *)&local_50);
    QDebug::operator<<(pQVar4,')');
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  pQVar2 = (address->d).d.ptr;
  (address->d).d.ptr = (QHostAddressPrivate *)0x0;
  *(QHostAddressPrivate **)d.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)d.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug d, const QHostAddress &address)
{
    QDebugStateSaver saver(d);
    d.resetFormat().nospace();
    if (address == QHostAddress::Any)
        d << "QHostAddress(QHostAddress::Any)";
    else
        d << "QHostAddress(" << address.toString() << ')';
    return d;
}